

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

void __thiscall rw::Geometry::generateTriangles(Geometry *this,int8 *adc)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint16 uVar7;
  uint uVar8;
  MeshHeader *pMVar9;
  long lVar10;
  Material **ppMVar11;
  MeshHeader *pMVar12;
  Triangle *pTVar13;
  uint16 uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  MeshHeader *pMVar18;
  int8 *piVar19;
  uint32 j;
  ulong uVar20;
  int32 i;
  uint32 j_1;
  uint uVar21;
  
  pMVar9 = this->meshHeader;
  this->numTriangles = 0;
  uVar1 = pMVar9->numMeshes;
  if (uVar1 != 0) {
    pMVar12 = pMVar9 + 1;
    uVar16 = 0;
    iVar15 = 0;
    pMVar18 = pMVar12;
    piVar19 = adc;
    do {
      uVar17 = pMVar18->totalIndices;
      if (2 < (ulong)uVar17) {
        if (pMVar9->flags == 1) {
          uVar20 = 0;
          do {
            if ((adc == (int8 *)0x0) || (piVar19[uVar20 + 2] == '\0')) {
              lVar10 = *(long *)pMVar18;
              sVar2 = *(short *)(lVar10 + uVar20 * 2);
              sVar3 = *(short *)(lVar10 + 2 + uVar20 * 2);
              if ((sVar2 != sVar3) &&
                 ((sVar4 = *(short *)(lVar10 + 4 + uVar20 * 2), sVar2 != sVar4 && (sVar3 != sVar4)))
                 ) {
                iVar15 = iVar15 + 1;
                this->numTriangles = iVar15;
              }
            }
            uVar20 = uVar20 + 1;
          } while (uVar17 - 2 != uVar20);
        }
        else {
          iVar15 = iVar15 + uVar17 / 3;
          this->numTriangles = iVar15;
        }
      }
      pMVar18 = (MeshHeader *)&pMVar18[1].totalIndices;
      piVar19 = piVar19 + uVar17;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar1);
    if (uVar1 != 0) {
      pTVar13 = this->triangles;
      ppMVar11 = (this->matList).materials;
      uVar16 = (this->matList).numMaterials;
      uVar17 = 0;
      piVar19 = adc;
      do {
        uVar8 = pMVar12->totalIndices;
        if (2 < (ulong)uVar8) {
          uVar14 = 0xffff;
          if (0 < (int)uVar16) {
            uVar20 = 0;
            do {
              if (ppMVar11[uVar20] == *(Material **)(pMVar12 + 1)) {
                uVar14 = (uint16)uVar20;
                break;
              }
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
          }
          if (pMVar9->flags == 1) {
            uVar20 = 0;
            do {
              uVar21 = (uint)uVar20;
              if ((adc == (int8 *)0x0) || (piVar19[uVar21 + 2] == '\0')) {
                lVar10 = *(long *)pMVar12;
                uVar5 = *(uint16 *)(lVar10 + uVar20 * 2);
                uVar6 = *(uint16 *)(lVar10 + 2 + uVar20 * 2);
                if ((uVar5 != uVar6) &&
                   ((uVar7 = *(uint16 *)(lVar10 + 4 + uVar20 * 2), uVar5 != uVar7 &&
                    (uVar6 != uVar7)))) {
                  pTVar13->v[0] = uVar5;
                  pTVar13->v[1] = *(uint16 *)(lVar10 + (ulong)((uVar21 & 1) + 1 + uVar21) * 2);
                  pTVar13->v[2] = *(uint16 *)(lVar10 + (ulong)(uVar21 + 2 & 0xfffffffe) * 2);
                  pTVar13->matId = uVar14;
                  pTVar13 = pTVar13 + 1;
                }
              }
              uVar20 = uVar20 + 1;
            } while (uVar8 - 2 != uVar20);
          }
          else {
            lVar10 = *(long *)pMVar12;
            uVar20 = 0;
            do {
              iVar15 = (int)uVar20;
              pTVar13->v[0] = *(uint16 *)(lVar10 + uVar20 * 2);
              pTVar13->v[1] = *(uint16 *)(lVar10 + (ulong)(iVar15 + 1) * 2);
              pTVar13->v[2] = *(uint16 *)(lVar10 + (ulong)(iVar15 + 2) * 2);
              pTVar13->matId = uVar14;
              pTVar13 = pTVar13 + 1;
              uVar20 = (ulong)(iVar15 + 3U);
            } while (iVar15 + 3U < uVar8 - 2);
          }
        }
        pMVar12 = (MeshHeader *)&pMVar12[1].totalIndices;
        piVar19 = piVar19 + uVar8;
        uVar17 = uVar17 + 1;
      } while (uVar17 < pMVar9->numMeshes);
    }
  }
  return;
}

Assistant:

void
Geometry::generateTriangles(int8 *adc)
{
	MeshHeader *header = this->meshHeader;
	assert(header != nil);

	this->numTriangles = 0;
	Mesh *m = header->getMeshes();
	int8 *adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			// shouldn't happen but it does
			adcbits += m->numIndices;
			m++;
			continue;
		}
		if(header->flags == MeshHeader::TRISTRIP){
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if(!(adc && adcbits[j+2]) &&
				   !isDegenerate(&m->indices[j]))
					this->numTriangles++;
			}
		}else
			this->numTriangles += m->numIndices/3;
		adcbits += m->numIndices;
		m++;
	}

	Triangle *tri = this->triangles;
	m = header->getMeshes();
	adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			adcbits += m->numIndices;
			m++;
			continue;
		}
		int32 matid = this->matList.findIndex(m->material);
		if(header->flags == MeshHeader::TRISTRIP)
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if((adc && adcbits[j+2]) ||
				   isDegenerate(&m->indices[j]))
					continue;
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1 + (j%2)];
				tri->v[2] = m->indices[j+2 - (j%2)];
				tri->matId = matid;
				tri++;
			}
		else
			for(uint32 j = 0; j < m->numIndices-2; j+=3){
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1];
				tri->v[2] = m->indices[j+2];
				tri->matId = matid;
				tri++;
			}
		adcbits += m->numIndices;
		m++;
	}
}